

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFile.cpp
# Opt level: O1

CK_ATTRIBUTE_TYPE __thiscall ObjectFile::nextAttributeType(ObjectFile *this,CK_ATTRIBUTE_TYPE type)

{
  _Rb_tree_node_base *p_Var1;
  _Rb_tree_node_base *p_Var2;
  _Rb_tree_header *p_Var3;
  CK_ATTRIBUTE_TYPE CVar4;
  MutexLocker lock;
  MutexLocker local_20;
  
  MutexLocker::MutexLocker(&local_20,this->objectMutex);
  p_Var3 = &(this->attributes)._M_t._M_impl.super__Rb_tree_header;
  p_Var1 = (this->attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var2 = &p_Var3->_M_header;
  for (; p_Var1 != (_Rb_tree_node_base *)0x0;
      p_Var1 = (&p_Var1->_M_left)[*(ulong *)(p_Var1 + 1) <= type]) {
    if (type < *(ulong *)(p_Var1 + 1)) {
      p_Var2 = p_Var1;
    }
  }
  for (; ((_Rb_tree_header *)p_Var2 != p_Var3 && (p_Var2[1]._M_parent == (_Base_ptr)0x0));
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
  }
  if ((_Rb_tree_header *)p_Var2 == p_Var3) {
    CVar4 = 0;
  }
  else {
    CVar4 = *(CK_ATTRIBUTE_TYPE *)(p_Var2 + 1);
  }
  MutexLocker::~MutexLocker(&local_20);
  return CVar4;
}

Assistant:

CK_ATTRIBUTE_TYPE ObjectFile::nextAttributeType(CK_ATTRIBUTE_TYPE type)
{
	MutexLocker lock(objectMutex);

	std::map<CK_ATTRIBUTE_TYPE, OSAttribute*>::iterator n = attributes.upper_bound(type);

	// skip null attributes
	while ((n != attributes.end()) && (n->second == NULL))
		++n;

	// return type or CKA_CLASS (= 0)
	if (n == attributes.end())
	{
		return CKA_CLASS;
	}
	else
	{
		return n->first;
	}
}